

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O2

void decusecount68k(FX *frame68k)

{
  ushort uVar1;
  DLword DVar2;
  LispPTR LVar3;
  LispPTR *SAddr;
  uint uVar4;
  FX *pFVar5;
  FX *frame68k_00;
  
  if ((frame68k != (FX *)0x0) && ((FX *)Stackspace != frame68k)) {
    while (DVar2 = StackOffsetFromNative(frame68k), DVar2 != 0) {
      uVar1 = *(ushort *)&frame68k->field_0x2;
      if ((char)uVar1 != '\0') {
        *(ushort *)&frame68k->field_0x2 = uVar1 & 0xff00 | uVar1 - 1 & 0xff;
        return;
      }
      frame68k_00 = (FX *)((ulong)(((*(uint *)frame68k & 0xfffffffe) - 10 & 0xffff) * 2) +
                          (long)Stackspace);
      if ((frame68k->alink & 1) == 0) {
        LVar3 = LAddrFromNative(&frame68k[-1].clink);
        DVar2 = (DLword)LVar3;
      }
      else {
        DVar2 = frame68k->blink;
      }
      SAddr = NativeAligned4FromStackOffset(DVar2);
      pFVar5 = (FX *)((ulong)((*(int *)((long)&frame68k->alink +
                                       (ulong)((*(uint *)frame68k & 1) << 4)) - 10U & 0xffff) * 2) +
                     (long)Stackspace);
      uVar1 = frame68k->nextblock;
      LVar3 = LAddrFromNative(frame68k);
      uVar4 = (uint)uVar1 - (LVar3 & 0xffff);
      if ((frame68k[-1].blink & 0x200) == 0) {
        if ((int)uVar4 < 1) {
          error("creating 0 length free stack block");
        }
        if ((uVar4 & 1) != 0) {
          error("creating odd length free stack block");
        }
      }
      else {
        if ((int)uVar4 < -1) {
          error("creating 0 length free stack block");
        }
        if ((uVar4 & 1) != 0) {
          error("creating odd length free stack block");
        }
        frame68k = (FX *)&frame68k[-1].clink;
        uVar4 = uVar4 + 2;
      }
      *(uint *)frame68k = uVar4 & 0xffff | 0xa0000000;
      uVar1 = *(ushort *)((long)SAddr + 2);
      if ((char)uVar1 == '\0') {
        DVar2 = StackOffsetFromNative(SAddr);
        if ((int)((uint)DVar2 - (uint)(ushort)*SAddr) < -1) {
          error("creating 0 length free stack block");
        }
        DVar2 = StackOffsetFromNative(SAddr);
        if ((DVar2 - (short)*SAddr & 1) != 0) {
          error("creating odd length free stack block");
        }
        DVar2 = StackOffsetFromNative(SAddr);
        *(uint *)(Stackspace + (ushort)*SAddr) =
             ((uint)DVar2 - (uint)(ushort)*SAddr) + 2 & 0xffff | 0xa0000000;
      }
      else {
        *(ushort *)((long)SAddr + 2) = uVar1 & 0xff00 | uVar1 - 1 & 0xff;
      }
      frame68k = pFVar5;
      if (frame68k_00 != pFVar5) {
        decusecount68k(frame68k_00);
      }
    }
  }
  return;
}

Assistant:

void decusecount68k(FX *frame68k) {
  DLword *alink68k;
  Bframe *blink68k;
  DLword *clink68k;
  /*** DLword *ivar68k; */
  int size;

  if (FX_INVALIDP(frame68k)) return;
  CHECK_FX(frame68k);
  /* I don't check if \INTERRUPTABLE is NIL */
  while (StackOffsetFromNative(frame68k)) {
    if (frame68k->usecount != 0) {
      frame68k->usecount--;
      return;
    } else {
      alink68k = NativeAligned2FromStackOffset(GETALINK(frame68k));
      blink68k = (Bframe *)NativeAligned4FromStackOffset(GETBLINK(frame68k));
      clink68k = NativeAligned2FromStackOffset(GETCLINK(frame68k));

      size = FX_size(frame68k);

      if (((Bframe *)DUMMYBF(frame68k))->residual) { /* this frame has dummy BF */
        MAKEFREEBLOCK(((DLword *)frame68k) - DLWORDSPER_CELL, size + DLWORDSPER_CELL);
      } else {
        MAKEFREEBLOCK(frame68k, size);
      }

      if (blink68k->usecnt != 0) {
        blink68k->usecnt--;
      } else {
        /***    ivar68k=NativeAligned2FromStackOffset(blink68k->ivar);
            GETWORD(ivar68k)=STK_FSB_WORD;
            GETWORD(ivar68k+1)=ivar68k -(DLword *)blink68k +2; **/

        MAKEFREEBLOCK(NativeAligned2FromStackOffset(blink68k->ivar), BF_size(blink68k));
      }
      if (alink68k != clink68k) decusecount68k((FX *)alink68k);

      frame68k = (FX *)clink68k;

    } /* else end */

  } /*while end */
}